

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O3

void Sfm_LibStop(Sfm_Lib_t *p)

{
  Vec_Mem_t *pVVar1;
  int *piVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  
  pVVar1 = p->vTtMem;
  if (pVVar1 == (Vec_Mem_t *)0x0) goto LAB_004bee26;
  pVVar4 = pVVar1->vTable;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      pVVar1->vTable->pArray = (int *)0x0;
      pVVar4 = pVVar1->vTable;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_004bedea;
    }
    free(pVVar4);
    pVVar1->vTable = (Vec_Int_t *)0x0;
  }
LAB_004bedea:
  pVVar4 = pVVar1->vNexts;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      pVVar1->vNexts->pArray = (int *)0x0;
      pVVar4 = pVVar1->vNexts;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_004bee26;
    }
    free(pVVar4);
    pVVar1->vNexts = (Vec_Int_t *)0x0;
  }
LAB_004bee26:
  pVVar1 = p->vTtMem;
  iVar3 = pVVar1->iPage;
  if (-1 < iVar3) {
    lVar5 = -1;
    do {
      if (pVVar1->ppPages[lVar5 + 1] != (word *)0x0) {
        free(pVVar1->ppPages[lVar5 + 1]);
        pVVar1->ppPages[lVar5 + 1] = (word *)0x0;
        iVar3 = pVVar1->iPage;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar3);
  }
  if (pVVar1->ppPages != (word **)0x0) {
    free(pVVar1->ppPages);
  }
  free(pVVar1);
  piVar2 = (p->vLists).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vLists).pArray = (int *)0x0;
  }
  (p->vLists).nCap = 0;
  (p->vLists).nSize = 0;
  piVar2 = (p->vCounts).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vCounts).pArray = (int *)0x0;
  }
  (p->vCounts).nCap = 0;
  (p->vCounts).nSize = 0;
  piVar2 = (p->vHits).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vHits).pArray = (int *)0x0;
  }
  (p->vHits).nCap = 0;
  (p->vHits).nSize = 0;
  piVar2 = (p->vProfs).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vProfs).pArray = (int *)0x0;
  }
  (p->vProfs).nCap = 0;
  (p->vProfs).nSize = 0;
  piVar2 = (p->vStore).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vStore).pArray = (int *)0x0;
  }
  (p->vStore).nCap = 0;
  (p->vStore).nSize = 0;
  piVar2 = (p->vTemp).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vTemp).pArray = (int *)0x0;
  }
  (p->vTemp).nCap = 0;
  (p->vTemp).nSize = 0;
  if (p->pCells != (Mio_Cell2_t *)0x0) {
    free(p->pCells);
    p->pCells = (Mio_Cell2_t *)0x0;
  }
  if (p->pObjs != (Sfm_Fun_t *)0x0) {
    free(p->pObjs);
  }
  free(p);
  return;
}

Assistant:

void Sfm_LibStop( Sfm_Lib_t * p )
{
    Vec_MemHashFree( p->vTtMem );
    Vec_MemFree( p->vTtMem );
    Vec_IntErase( &p->vLists );
    Vec_IntErase( &p->vCounts );
    Vec_IntErase( &p->vHits );
    Vec_IntErase( &p->vProfs );
    Vec_IntErase( &p->vStore );
    Vec_IntErase( &p->vTemp );
    ABC_FREE( p->pCells );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
}